

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O0

void xc_lda(xc_func_type *p,size_t np,double *rho,double *zk,double *vrho,double *v2rho2,
           double *v3rho3,double *v4rho4)

{
  long in_RCX;
  long in_R8;
  long in_R9;
  xc_lda_out_params out;
  int order;
  xc_lda_out_params *in_stack_000001c0;
  double *in_stack_000001c8;
  size_t in_stack_000001d0;
  int in_stack_000001dc;
  xc_func_type *in_stack_000001e0;
  long local_60;
  long local_58;
  long local_50;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  
  local_34 = -1;
  if (in_RCX != 0) {
    local_34 = 0;
  }
  if (in_R8 != 0) {
    local_34 = 1;
  }
  if (in_R9 != 0) {
    local_34 = 2;
  }
  if (out.zk != (double *)0x0) {
    local_34 = 3;
  }
  if (out.vrho != (double *)0x0) {
    local_34 = 4;
  }
  if (-1 < local_34) {
    local_30 = in_R9;
    local_28 = in_R8;
    local_20 = in_RCX;
    memset(&local_60,0,0x28);
    local_60 = local_20;
    local_58 = local_28;
    local_50 = local_30;
    xc_lda_new(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8,
               in_stack_000001c0);
  }
  return;
}

Assistant:

void
xc_lda(const xc_func_type *p, size_t np, const double *rho, double *zk, double *vrho, double *v2rho2, double *v3rho3, double *v4rho4)
{
  int order = -1;

  if(zk     != NULL) order = 0;
  if(vrho   != NULL) order = 1;
  if(v2rho2 != NULL) order = 2;
  if(v3rho3 != NULL) order = 3;
  if(v4rho4 != NULL) order = 4;

  if(order < 0) return;

  xc_lda_out_params out;
  libxc_memset(&out, 0, sizeof(xc_lda_out_params));
  out.zk     = zk;
  out.vrho   = vrho;
  out.v2rho2 = v2rho2;
  out.v3rho3 = v3rho3;
  out.v4rho4 = v4rho4;

  xc_lda_new(p, order, np, rho, &out);
}